

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

void AddTriangles(Level *Lvl)

{
  uint uVar1;
  Triangle *NewTri;
  Vertex *pVVar2;
  double *pdVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  for (NewTri = Lvl->AllTris; NewTri != (Triangle *)0x0; NewTri = NewTri->Next) {
    pVVar2 = NewTri->Edges[0];
    dVar6 = pVVar2->Pos[0];
    (NewTri->Bounder).BR.Pos[0] = dVar6;
    (NewTri->Bounder).TL.Pos[0] = dVar6;
    dVar7 = pVVar2->Pos[1];
    (NewTri->Bounder).BR.Pos[1] = dVar7;
    (NewTri->Bounder).TL.Pos[1] = dVar7;
    lVar4 = 0x14;
    dVar8 = dVar6;
    dVar9 = dVar7;
    dVar10 = dVar7;
    do {
      iVar5 = (int)lVar4 + -0x13;
      if ((int)lVar4 - 0x11U < 2) {
        iVar5 = 2;
      }
      pdVar3 = *(double **)((long)(&NewTri->Bounder + -3) + lVar4 * 8);
      dVar11 = *pdVar3;
      if (dVar11 < dVar6) {
        (NewTri->Bounder).TL.Pos[0] = dVar11;
        dVar6 = dVar11;
        dVar11 = *pdVar3;
      }
      if (dVar8 < dVar11) {
        (NewTri->Bounder).BR.Pos[0] = dVar11;
        dVar8 = dVar11;
      }
      uVar1 = *(uint *)((long)(NewTri->Bounder).TL.Pos + lVar4 * 4);
      if (((char)uVar1 < '\0') || ((NewTri->EdgeFlags[iVar5] & 0x80) != 0)) {
        dVar11 = pdVar3[1];
        dVar12 = (double)(uVar1 & 0x7f);
        dVar13 = dVar11 - dVar12;
        if (dVar13 < dVar10) {
          (NewTri->Bounder).TL.Pos[1] = dVar13;
          dVar11 = pdVar3[1];
          dVar9 = dVar13;
          dVar10 = dVar13;
        }
        dVar11 = dVar11 + dVar12;
      }
      else {
        dVar11 = pdVar3[1];
        dVar10 = dVar9;
        if (dVar11 < dVar9) {
          (NewTri->Bounder).TL.Pos[1] = dVar11;
          dVar9 = dVar11;
          dVar10 = dVar11;
          dVar11 = pdVar3[1];
        }
      }
      if (dVar7 < dVar11) {
        (NewTri->Bounder).BR.Pos[1] = dVar11;
        dVar7 = dVar11;
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0x11);
    AddTriangle(Lvl,NewTri);
  }
  return;
}

Assistant:

static void AddTriangles(struct Level *Lvl)
{
   struct Triangle *Tri = Lvl->AllTris;

   while (Tri) {
      int c = 3;

      /* determine axis aligned bounding box */
      Tri->Bounder.TL.Pos[0] = Tri->Bounder.BR.Pos[0] = Tri->Edges[0]->Pos[0];
      Tri->Bounder.TL.Pos[1] = Tri->Bounder.BR.Pos[1] = Tri->Edges[0]->Pos[1];

      while (c--) {
         int lc = c - 1;

         if (lc < 0)
            lc = 2;

         /* check if this x expands the bounding box either leftward or rightward */
         if (Tri->Edges[c]->Pos[0] < Tri->Bounder.TL.Pos[0])
            Tri->Bounder.TL.Pos[0] = Tri->Edges[c]->Pos[0];
         if (Tri->Edges[c]->Pos[0] > Tri->Bounder.BR.Pos[0])
            Tri->Bounder.BR.Pos[0] = Tri->Edges[c]->Pos[0];

         /* check y */
         if ((Tri->EdgeFlags[c] & TRIFLAGS_EDGE)
             || (Tri->EdgeFlags[lc] & TRIFLAGS_EDGE)) {
            if (Tri->Edges[c]->Pos[1] -
                (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH) < Tri->Bounder.TL.Pos[1])
               Tri->Bounder.TL.Pos[1] =
                  Tri->Edges[c]->Pos[1] -
                  (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH);
            if (Tri->Edges[c]->Pos[1] + (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH) >
                Tri->Bounder.BR.Pos[1])
               Tri->Bounder.BR.Pos[1] =
                  Tri->Edges[c]->Pos[1] +
                  (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH);
         } else {
            if (Tri->Edges[c]->Pos[1] < Tri->Bounder.TL.Pos[1])
               Tri->Bounder.TL.Pos[1] = Tri->Edges[c]->Pos[1];
            if (Tri->Edges[c]->Pos[1] > Tri->Bounder.BR.Pos[1])
               Tri->Bounder.BR.Pos[1] = Tri->Edges[c]->Pos[1];
         }
      }

      /* insert into tree */
      AddTriangle(Lvl, Tri);

      /* move along linked list */
      Tri = Tri->Next;
   }
}